

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

double __thiscall QStringView::toDouble(QStringView *this,bool *ok)

{
  QStringView s;
  bool bVar1;
  qsizetype in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QSimpleParsedNumber<double> QVar2;
  QSimpleParsedNumber<double> r;
  QStringView string;
  QVarLengthArray<unsigned_char,_256LL> latin1;
  char16_t *in_stack_fffffffffffffe38;
  uchar *in_stack_fffffffffffffe40;
  QVarLengthArray<unsigned_char,_256LL> *pQVar3;
  undefined7 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4f;
  QVarLengthArray<unsigned_char,_256LL> *in_stack_fffffffffffffe50;
  qsizetype in_stack_fffffffffffffe60;
  storage_type_conflict *in_stack_fffffffffffffe68;
  QVLABase<unsigned_char> *this_00;
  StrayCharacterMode in_stack_fffffffffffffe94;
  QSimpleParsedNumber<double> local_158;
  undefined8 local_148;
  undefined8 uStack_140;
  QStringView local_138;
  QVLABase<unsigned_char> local_120 [11];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_138.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  local_138.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_148 = *(undefined8 *)in_RDI;
  uStack_140 = *(undefined8 *)(in_RDI + 8);
  s.m_data = in_stack_fffffffffffffe68;
  s.m_size = in_stack_fffffffffffffe60;
  local_138 = anon_unknown.dwarf_ab58a6::qt_trimmed<QStringView>(s);
  this_00 = local_120;
  memset(this_00,0xaa,0x118);
  size(&local_138);
  QVarLengthArray<unsigned_char,_256LL>::QVarLengthArray
            (in_stack_fffffffffffffe50,CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48)
            );
  QVLABase<unsigned_char>::data(this_00);
  utf16(&local_138);
  size(&local_138);
  qt_to_latin1(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,0x51806f);
  local_158.result = -NAN;
  local_158.used = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QVLABase<unsigned_char>::data(local_120);
  size(&local_138);
  QVar2 = qt_asciiToDouble(in_RDI,in_RSI,in_stack_fffffffffffffe94);
  local_158.used = QVar2.used;
  local_158.result = QVar2.result;
  if (in_RSI != 0) {
    bVar1 = QSimpleParsedNumber<double>::ok(&local_158);
    *(bool *)in_RSI = bVar1;
  }
  pQVar3 = (QVarLengthArray<unsigned_char,_256LL> *)local_158.result;
  QVarLengthArray<unsigned_char,_256LL>::~QVarLengthArray
            ((QVarLengthArray<unsigned_char,_256LL> *)local_158.result);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (double)pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

double QStringView::toDouble(bool *ok) const
{
    QStringView string = qt_trimmed(*this);
    QVarLengthArray<uchar> latin1(string.size());
    qt_to_latin1(latin1.data(), string.utf16(), string.size());
    auto r = qt_asciiToDouble(reinterpret_cast<const char *>(latin1.data()), string.size());
    if (ok != nullptr)
        *ok = r.ok();
    return r.result;
}